

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.cpp
# Opt level: O0

PixelSensor * pbrt::PixelSensor::CreateDefault(Allocator alloc)

{
  undefined1 auVar1 [64];
  PixelSensor *pPVar2;
  FileLoc *in_stack_000001a8;
  Float in_stack_000001b4;
  RGBColorSpace *in_stack_000001b8;
  ParameterDictionary *in_stack_000001c0;
  Allocator in_stack_000001c8;
  undefined1 local_78 [40];
  undefined1 local_50 [24];
  undefined1 auStack_38 [40];
  
  auVar1 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  auStack_38 = auVar1._24_40_;
  auVar1 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_78 = auVar1._0_40_;
  local_50 = auVar1._40_24_;
  ParameterDictionary::ParameterDictionary((ParameterDictionary *)local_78);
  pPVar2 = Create(in_stack_000001c0,in_stack_000001b8,in_stack_000001b4,in_stack_000001a8,
                  in_stack_000001c8);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x6d4d2e);
  return pPVar2;
}

Assistant:

PixelSensor *PixelSensor::CreateDefault(Allocator alloc) {
    return Create(ParameterDictionary(), RGBColorSpace::sRGB, 1.0, nullptr, alloc);
}